

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.hpp
# Opt level: O0

bool __thiscall
units::fixed_precise_measurement::operator==(fixed_precise_measurement *this,double val)

{
  bool local_21;
  double val_local;
  fixed_precise_measurement *this_local;
  
  if ((this->value_ != val) || (NAN(this->value_) || NAN(val))) {
    local_21 = detail::compare_round_equals_precise(this->value_,val);
  }
  else {
    local_21 = true;
  }
  return local_21;
}

Assistant:

bool operator==(double val) const
    {
        return (value_ == val) ?
            true :
            detail::compare_round_equals_precise(value_, val);
    }